

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O3

void WebPRescalerExportRow(WebPRescaler *wrk)

{
  WebPRescalerExportRowFunc *pp_Var1;
  long lVar2;
  rescaler_t *prVar3;
  
  if (0 < wrk->y_accum) {
    return;
  }
  if (wrk->y_expand == 0) {
    if (wrk->fxy_scale == 0) {
      if (0 < wrk->dst_width * wrk->num_channels) {
        prVar3 = wrk->irow;
        lVar2 = 0;
        do {
          wrk->dst[lVar2] = (uint8_t)prVar3[lVar2];
          prVar3 = wrk->irow;
          prVar3[lVar2] = 0;
          lVar2 = lVar2 + 1;
        } while (lVar2 < (long)wrk->dst_width * (long)wrk->num_channels);
      }
      goto LAB_00115bdb;
    }
    pp_Var1 = &WebPRescalerExportRowShrink;
  }
  else {
    pp_Var1 = &WebPRescalerExportRowExpand;
  }
  (**pp_Var1)(wrk);
LAB_00115bdb:
  wrk->y_accum = wrk->y_accum + wrk->y_add;
  wrk->dst = wrk->dst + wrk->dst_stride;
  wrk->dst_y = wrk->dst_y + 1;
  return;
}

Assistant:

void WebPRescalerExportRow(WebPRescaler* const wrk) {
  if (wrk->y_accum <= 0) {
    assert(!WebPRescalerOutputDone(wrk));
    if (wrk->y_expand) {
      WebPRescalerExportRowExpand(wrk);
    } else if (wrk->fxy_scale) {
      WebPRescalerExportRowShrink(wrk);
    } else {  // special case
      int i;
      assert(wrk->src_height == wrk->dst_height && wrk->x_add == 1);
      assert(wrk->src_width == 1 && wrk->dst_width <= 2);
      for (i = 0; i < wrk->num_channels * wrk->dst_width; ++i) {
        wrk->dst[i] = wrk->irow[i];
        wrk->irow[i] = 0;
      }
    }
    wrk->y_accum += wrk->y_add;
    wrk->dst += wrk->dst_stride;
    ++wrk->dst_y;
  }
}